

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

Settings * __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Settings::operator=(Settings *this,Settings *settings)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x1a; lVar1 = lVar1 + 1) {
    this->_boolParamValues[lVar1] = settings->_boolParamValues[lVar1];
  }
  for (lVar1 = 7; lVar1 != 0x23; lVar1 = lVar1 + 1) {
    *(undefined4 *)(this->_boolParamValues + lVar1 * 4) =
         *(undefined4 *)(settings->_boolParamValues + lVar1 * 4);
  }
  for (lVar1 = 0x12; lVar1 != 0x2d; lVar1 = lVar1 + 1) {
    *(undefined8 *)(this->_boolParamValues + lVar1 * 8) =
         *(undefined8 *)(settings->_boolParamValues + lVar1 * 8);
  }
  return this;
}

Assistant:

typename SoPlexBase<R>::Settings& SoPlexBase<R>::Settings::operator=(const Settings& settings)
{
   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
      _boolParamValues[i] = settings._boolParamValues[i];

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
      _intParamValues[i] = settings._intParamValues[i];

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
      _realParamValues[i] = settings._realParamValues[i];

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
      _rationalParamValues[i] = settings._rationalParamValues[i];

#endif

   return *this;
}